

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

ambiguous_param * __thiscall
boost::runtime::specific_param_error<boost::runtime::ambiguous_param,boost::runtime::input_error>::
operator<<(specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error> *this,
          basic_cstring<const_char> *val)

{
  specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error> *psVar1;
  ambiguous_param *in_RSI;
  ambiguous_param *in_RDI;
  basic_cstring<const_char> *in_stack_00000128;
  string local_38 [56];
  
  psVar1 = &in_RSI->
            super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
  ;
  unit_test::utils::string_cast<boost::unit_test::basic_cstring<char_const>>(in_stack_00000128);
  std::__cxx11::string::append((string *)&(psVar1->super_input_error).super_param_error.msg);
  std::__cxx11::string::~string(local_38);
  ambiguous_param::ambiguous_param(in_RSI,in_RDI);
  return in_RDI;
}

Assistant:

Derived operator<<(T const& val) &&
    {
        this->msg.append( unit_test::utils::string_cast( val ) );

        return reinterpret_cast<Derived&&>(*this);
    }